

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceMatrixDecomposition.cpp
# Opt level: O2

void __thiscall
OpenMD::ForceMatrixDecomposition::distributeInitialData(ForceMatrixDecomposition *this)

{
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *pvVar1;
  vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> *this_00;
  int i_00;
  SnapshotManager *pSVar2;
  Snapshot *this_01;
  SimInfo *pSVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  AtomType *pAVar7;
  long lVar8;
  int i;
  vector<int,_std::allocator<int>_> globalGroupMembership;
  int local_a4;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_a0;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_98;
  vector<int,_std::allocator<int>_> *local_90;
  _Vector_base<double,_std::allocator<double>_> local_88;
  _Vector_base<int,_std::allocator<int>_> local_70;
  vector<int,_std::allocator<int>_> *local_58;
  long local_50;
  PairList *local_48;
  PairList *local_40;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_38;
  
  pSVar2 = (this->super_ForceDecomposition).sman_;
  this_01 = pSVar2->currentSnapshot_;
  (this->super_ForceDecomposition).snap_ = this_01;
  (this->super_ForceDecomposition).atomStorageLayout_ = pSVar2->atomStorageLayout_;
  (this->super_ForceDecomposition).ff_ = ((this->super_ForceDecomposition).info_)->forceField_;
  iVar5 = Snapshot::getNumberOfAtoms(this_01);
  this->nLocal_ = iVar5;
  uVar6 = SimInfo::getNLocalCutoffGroups((this->super_ForceDecomposition).info_);
  this->nGroups_ = uVar6;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_70,
             &((this->super_ForceDecomposition).info_)->identArray_);
  std::vector<int,_std::allocator<int>_>::_M_move_assign
            (&(this->super_ForceDecomposition).idents,&local_70);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_70);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_70,
             &((this->super_ForceDecomposition).info_)->regions_);
  std::vector<int,_std::allocator<int>_>::_M_move_assign
            (&(this->super_ForceDecomposition).regions,&local_70);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_70);
  SimInfo::getGlobalAtomIndices
            ((vector<int,_std::allocator<int>_> *)&local_70,(this->super_ForceDecomposition).info_);
  local_90 = &this->AtomLocalToGlobal;
  std::vector<int,_std::allocator<int>_>::_M_move_assign(local_90,&local_70);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_70);
  SimInfo::getGlobalGroupIndices
            ((vector<int,_std::allocator<int>_> *)&local_70,(this->super_ForceDecomposition).info_);
  local_58 = &this->cgLocalToGlobal;
  std::vector<int,_std::allocator<int>_>::_M_move_assign(local_58,&local_70);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_70);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_70,
             &((this->super_ForceDecomposition).info_)->globalGroupMembership_);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_88,
             &((this->super_ForceDecomposition).info_)->massFactors_);
  std::vector<double,_std::allocator<double>_>::_M_move_assign
            (&(this->super_ForceDecomposition).massFactors,&local_88);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_88);
  pSVar3 = (this->super_ForceDecomposition).info_;
  DataStorage::setStorageLayout
            (&((this->super_ForceDecomposition).snap_)->cgData,
             (uint)(this->super_ForceDecomposition).needVelocities_ * 2 + 1);
  pvVar1 = &(this->super_ForceDecomposition).excludesForAtom;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::clear(pvVar1);
  local_38 = pvVar1;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::resize(pvVar1,(long)this->nLocal_);
  pvVar1 = &(this->super_ForceDecomposition).toposForAtom;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::clear(pvVar1);
  local_98 = pvVar1;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::resize(pvVar1,(long)this->nLocal_);
  pvVar1 = &(this->super_ForceDecomposition).topoDist;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::clear(pvVar1);
  local_a0 = pvVar1;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::resize(pvVar1,(long)this->nLocal_);
  local_40 = &pSVar3->oneThreeInteractions_;
  local_48 = &pSVar3->oneFourInteractions_;
  iVar5 = this->nLocal_;
  lVar8 = 0;
  while (lVar8 < iVar5) {
    i_00 = (local_90->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
           ._M_start[lVar8];
    local_50 = lVar8;
    for (local_88._M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
        (int)local_88._M_impl.super__Vector_impl_data._M_start < iVar5;
        local_88._M_impl.super__Vector_impl_data._M_start._0_4_ =
             (int)local_88._M_impl.super__Vector_impl_data._M_start + 1) {
      iVar5 = (local_90->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start
              [(int)local_88._M_impl.super__Vector_impl_data._M_start];
      bVar4 = PairList::hasPair(&pSVar3->excludedInteractions_,i_00,iVar5);
      if (bVar4) {
        std::vector<int,_std::allocator<int>_>::push_back
                  ((local_38->
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + lVar8,
                   (value_type_conflict2 *)&local_88);
      }
      bVar4 = PairList::hasPair(&pSVar3->oneTwoInteractions_,i_00,iVar5);
      if (bVar4) {
        std::vector<int,_std::allocator<int>_>::push_back
                  ((local_98->
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + lVar8,
                   (value_type_conflict2 *)&local_88);
        local_a4 = 1;
        std::vector<int,_std::allocator<int>_>::emplace_back<int>
                  ((local_a0->
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + lVar8,&local_a4);
      }
      else {
        bVar4 = PairList::hasPair(local_40,i_00,iVar5);
        if (bVar4) {
          std::vector<int,_std::allocator<int>_>::push_back
                    ((local_98->
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start + lVar8,
                     (value_type_conflict2 *)&local_88);
          local_a4 = 2;
          std::vector<int,_std::allocator<int>_>::emplace_back<int>
                    ((local_a0->
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start + lVar8,&local_a4);
        }
        else {
          bVar4 = PairList::hasPair(local_48,i_00,iVar5);
          if (bVar4) {
            std::vector<int,_std::allocator<int>_>::push_back
                      ((local_98->
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start + lVar8,
                       (value_type_conflict2 *)&local_88);
            local_a4 = 3;
            std::vector<int,_std::allocator<int>_>::emplace_back<int>
                      ((local_a0->
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start + lVar8,&local_a4);
          }
        }
      }
      iVar5 = this->nLocal_;
    }
    lVar8 = local_50 + 1;
  }
  this_00 = &(this->super_ForceDecomposition).atypesLocal;
  std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>::resize(this_00,(long)iVar5);
  for (lVar8 = 0; lVar8 < this->nLocal_; lVar8 = lVar8 + 1) {
    pAVar7 = ForceField::getAtomType
                       ((this->super_ForceDecomposition).ff_,
                        (this->super_ForceDecomposition).idents.
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar8]);
    (this_00->super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>)._M_impl.
    super__Vector_impl_data._M_start[lVar8] = pAVar7;
  }
  pvVar1 = &(this->super_ForceDecomposition).groupList_;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::clear(pvVar1);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::resize(pvVar1,(long)this->nGroups_);
  for (lVar8 = 0; lVar8 < this->nGroups_; lVar8 = lVar8 + 1) {
    iVar5 = (local_58->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_start[lVar8];
    for (local_88._M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
        (int)local_88._M_impl.super__Vector_impl_data._M_start < this->nLocal_;
        local_88._M_impl.super__Vector_impl_data._M_start._0_4_ =
             (int)local_88._M_impl.super__Vector_impl_data._M_start + 1) {
      if (local_70._M_impl.super__Vector_impl_data._M_start
          [(local_90->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
           ._M_start[(int)local_88._M_impl.super__Vector_impl_data._M_start]] == iVar5) {
        std::vector<int,_std::allocator<int>_>::push_back
                  ((pvVar1->
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + lVar8,
                   (value_type_conflict2 *)&local_88);
      }
    }
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_70);
  return;
}

Assistant:

void ForceMatrixDecomposition::distributeInitialData() {
    snap_              = sman_->getCurrentSnapshot();
    atomStorageLayout_ = sman_->getAtomStorageLayout();
    ff_                = info_->getForceField();
    nLocal_            = snap_->getNumberOfAtoms();

    nGroups_ = info_->getNLocalCutoffGroups();
    // gather the information for atomtype IDs (atids):
    idents                            = info_->getIdentArray();
    regions                           = info_->getRegions();
    AtomLocalToGlobal                 = info_->getGlobalAtomIndices();
    cgLocalToGlobal                   = info_->getGlobalGroupIndices();
    vector<int> globalGroupMembership = info_->getGlobalGroupMembership();

    massFactors = info_->getMassFactors();

    PairList* excludes = info_->getExcludedInteractions();
    PairList* oneTwo   = info_->getOneTwoInteractions();
    PairList* oneThree = info_->getOneThreeInteractions();
    PairList* oneFour  = info_->getOneFourInteractions();

    if (needVelocities_)
      snap_->cgData.setStorageLayout(DataStorage::dslPosition |
                                     DataStorage::dslVelocity);
    else
      snap_->cgData.setStorageLayout(DataStorage::dslPosition);

#ifdef IS_MPI

    MPI_Comm row = rowComm.getComm();
    MPI_Comm col = colComm.getComm();

    AtomPlanIntRow    = new Plan<int>(row, nLocal_);
    AtomPlanRealRow   = new Plan<RealType>(row, nLocal_);
    AtomPlanVectorRow = new Plan<Vector3d>(row, nLocal_);
    AtomPlanMatrixRow = new Plan<Mat3x3d>(row, nLocal_);
    AtomPlanPotRow    = new Plan<potVec>(row, nLocal_);

    AtomPlanIntColumn    = new Plan<int>(col, nLocal_);
    AtomPlanRealColumn   = new Plan<RealType>(col, nLocal_);
    AtomPlanVectorColumn = new Plan<Vector3d>(col, nLocal_);
    AtomPlanMatrixColumn = new Plan<Mat3x3d>(col, nLocal_);
    AtomPlanPotColumn    = new Plan<potVec>(col, nLocal_);

    cgPlanIntRow       = new Plan<int>(row, nGroups_);
    cgPlanVectorRow    = new Plan<Vector3d>(row, nGroups_);
    cgPlanIntColumn    = new Plan<int>(col, nGroups_);
    cgPlanVectorColumn = new Plan<Vector3d>(col, nGroups_);

    nAtomsInRow_  = AtomPlanIntRow->getSize();
    nAtomsInCol_  = AtomPlanIntColumn->getSize();
    nGroupsInRow_ = cgPlanIntRow->getSize();
    nGroupsInCol_ = cgPlanIntColumn->getSize();

    // Modify the data storage objects with the correct layouts and sizes:
    atomRowData.resize(nAtomsInRow_);
    atomRowData.setStorageLayout(atomStorageLayout_);
    atomColData.resize(nAtomsInCol_);
    atomColData.setStorageLayout(atomStorageLayout_);
    cgRowData.resize(nGroupsInRow_);
    cgRowData.setStorageLayout(DataStorage::dslPosition);
    cgColData.resize(nGroupsInCol_);
    if (needVelocities_)
      // we only need column velocities if we need them.
      cgColData.setStorageLayout(DataStorage::dslPosition |
                                 DataStorage::dslVelocity);
    else
      cgColData.setStorageLayout(DataStorage::dslPosition);

    identsRow.resize(nAtomsInRow_);
    identsCol.resize(nAtomsInCol_);

    AtomPlanIntRow->gather(idents, identsRow);
    AtomPlanIntColumn->gather(idents, identsCol);

    regionsRow.resize(nAtomsInRow_);
    regionsCol.resize(nAtomsInCol_);

    AtomPlanIntRow->gather(regions, regionsRow);
    AtomPlanIntColumn->gather(regions, regionsCol);

    // allocate memory for the parallel objects
    atypesRow.resize(nAtomsInRow_);
    atypesCol.resize(nAtomsInCol_);

    for (int i = 0; i < nAtomsInRow_; i++)
      atypesRow[i] = ff_->getAtomType(identsRow[i]);
    for (int i = 0; i < nAtomsInCol_; i++)
      atypesCol[i] = ff_->getAtomType(identsCol[i]);

    pot_row.resize(nAtomsInRow_);
    pot_col.resize(nAtomsInCol_);

    expot_row.resize(nAtomsInRow_);
    expot_col.resize(nAtomsInCol_);

    selepot_row.resize(nAtomsInRow_);
    selepot_col.resize(nAtomsInCol_);

    AtomRowToGlobal.resize(nAtomsInRow_);
    AtomColToGlobal.resize(nAtomsInCol_);
    AtomPlanIntRow->gather(AtomLocalToGlobal, AtomRowToGlobal);
    AtomPlanIntColumn->gather(AtomLocalToGlobal, AtomColToGlobal);

    cgRowToGlobal.resize(nGroupsInRow_);
    cgColToGlobal.resize(nGroupsInCol_);
    cgPlanIntRow->gather(cgLocalToGlobal, cgRowToGlobal);
    cgPlanIntColumn->gather(cgLocalToGlobal, cgColToGlobal);

    massFactorsRow.resize(nAtomsInRow_);
    massFactorsCol.resize(nAtomsInCol_);
    AtomPlanRealRow->gather(massFactors, massFactorsRow);
    AtomPlanRealColumn->gather(massFactors, massFactorsCol);

    groupListRow_.clear();
    groupListRow_.resize(nGroupsInRow_);
    for (int i = 0; i < nGroupsInRow_; i++) {
      int gid = cgRowToGlobal[i];
      for (int j = 0; j < nAtomsInRow_; j++) {
        int aid = AtomRowToGlobal[j];
        if (globalGroupMembership[aid] == gid) groupListRow_[i].push_back(j);
      }
    }

    groupListCol_.clear();
    groupListCol_.resize(nGroupsInCol_);
    for (int i = 0; i < nGroupsInCol_; i++) {
      int gid = cgColToGlobal[i];
      for (int j = 0; j < nAtomsInCol_; j++) {
        int aid = AtomColToGlobal[j];
        if (globalGroupMembership[aid] == gid) groupListCol_[i].push_back(j);
      }
    }

    excludesForAtom.clear();
    excludesForAtom.resize(nAtomsInRow_);
    toposForAtom.clear();
    toposForAtom.resize(nAtomsInRow_);
    topoDist.clear();
    topoDist.resize(nAtomsInRow_);
    for (int i = 0; i < nAtomsInRow_; i++) {
      int iglob = AtomRowToGlobal[i];

      for (int j = 0; j < nAtomsInCol_; j++) {
        int jglob = AtomColToGlobal[j];

        if (excludes->hasPair(iglob, jglob)) excludesForAtom[i].push_back(j);

        if (oneTwo->hasPair(iglob, jglob)) {
          toposForAtom[i].push_back(j);
          topoDist[i].push_back(1);
        } else {
          if (oneThree->hasPair(iglob, jglob)) {
            toposForAtom[i].push_back(j);
            topoDist[i].push_back(2);
          } else {
            if (oneFour->hasPair(iglob, jglob)) {
              toposForAtom[i].push_back(j);
              topoDist[i].push_back(3);
            }
          }
        }
      }
    }

#else
    excludesForAtom.clear();
    excludesForAtom.resize(nLocal_);
    toposForAtom.clear();
    toposForAtom.resize(nLocal_);
    topoDist.clear();
    topoDist.resize(nLocal_);

    for (int i = 0; i < nLocal_; i++) {
      int iglob = AtomLocalToGlobal[i];

      for (int j = 0; j < nLocal_; j++) {
        int jglob = AtomLocalToGlobal[j];

        if (excludes->hasPair(iglob, jglob)) excludesForAtom[i].push_back(j);

        if (oneTwo->hasPair(iglob, jglob)) {
          toposForAtom[i].push_back(j);
          topoDist[i].push_back(1);
        } else {
          if (oneThree->hasPair(iglob, jglob)) {
            toposForAtom[i].push_back(j);
            topoDist[i].push_back(2);
          } else {
            if (oneFour->hasPair(iglob, jglob)) {
              toposForAtom[i].push_back(j);
              topoDist[i].push_back(3);
            }
          }
        }
      }
    }
#endif

    // allocate memory for the parallel objects
    atypesLocal.resize(nLocal_);

    for (int i = 0; i < nLocal_; i++)
      atypesLocal[i] = ff_->getAtomType(idents[i]);

    groupList_.clear();
    groupList_.resize(nGroups_);
    for (int i = 0; i < nGroups_; i++) {
      int gid = cgLocalToGlobal[i];
      for (int j = 0; j < nLocal_; j++) {
        int aid = AtomLocalToGlobal[j];
        if (globalGroupMembership[aid] == gid) { groupList_[i].push_back(j); }
      }
    }
  }